

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HEkk.cpp
# Opt level: O0

bool __thiscall HEkk::lpFactorRowCompatible(HEkk *this)

{
  bool bVar1;
  undefined8 in_RDI;
  
  bVar1 = lpFactorRowCompatible(this,(HighsInt)((ulong)in_RDI >> 0x20));
  return bVar1;
}

Assistant:

bool HEkk::lpFactorRowCompatible() const {
  return lpFactorRowCompatible(this->lp_.num_row_);
}